

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O1

void __thiscall TxReconciliationTracker::Impl::ForgetPeer(Impl *this,NodeId peer_id)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __buckets_ptr pp_Var3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  bool bVar7;
  Logger *this_00;
  ulong uVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  char *in_stack_ffffffffffffffc0;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_30);
  pp_Var3 = (this->m_states)._M_h._M_buckets;
  uVar9 = (this->m_states)._M_h._M_bucket_count;
  uVar8 = (ulong)peer_id % uVar9;
  p_Var4 = pp_Var3[uVar8];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var4->_M_nxt, p_Var11 = p_Var4,
     (_Hash_node_base *)peer_id != p_Var4->_M_nxt[1]._M_nxt)) {
    while (p_Var10 = p_Var5, p_Var5 = p_Var10->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var5[1]._M_nxt % uVar9 != uVar8) ||
         (p_Var11 = p_Var10, (_Hash_node_base *)peer_id == p_Var5[1]._M_nxt)) goto LAB_00992209;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00992209:
  if (p_Var11 == (__node_base_ptr)0x0) goto LAB_009922db;
  p_Var5 = p_Var11->_M_nxt;
  p_Var6 = p_Var5->_M_nxt;
  if (p_Var4 == p_Var11) {
    if (p_Var6 == (_Hash_node_base *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)p_Var6[1]._M_nxt % uVar9;
      if (uVar9 == uVar8) goto LAB_00992274;
    }
    if (p_Var6 != (_Hash_node_base *)0x0) {
      pp_Var3[uVar9] = p_Var4;
    }
    p_Var1 = &(this->m_states)._M_h._M_before_begin;
    pp_Var3 = (this->m_states)._M_h._M_buckets;
    if (p_Var1 == pp_Var3[uVar8]) {
      p_Var1->_M_nxt = p_Var6;
    }
    pp_Var3[uVar8] = (__node_base_ptr)0x0;
  }
  else if ((p_Var6 != (_Hash_node_base *)0x0) &&
          (uVar9 = (ulong)p_Var6[1]._M_nxt % uVar9, uVar9 != uVar8)) {
    pp_Var3[uVar9] = p_Var11;
  }
LAB_00992274:
  p_Var11->_M_nxt = p_Var5->_M_nxt;
  operator_delete(p_Var5,0x30);
  psVar2 = &(this->m_states)._M_h._M_element_count;
  *psVar2 = *psVar2 - 1;
  if (p_Var11 != (__node_base_ptr)0x0) {
    this_00 = LogInstance();
    bVar7 = BCLog::Logger::WillLogCategoryLevel(this_00,TXRECONCILIATION,Debug);
    if (bVar7) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
      ;
      source_file._M_len = 0x62;
      logging_function._M_str = "ForgetPeer";
      logging_function._M_len = 10;
      LogPrintf_<long>(logging_function,source_file,0x85,
                       IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|RPC|BENCH|
                       MEMPOOL|TOR|NET,(Level)&stack0xffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (long *)peer_id);
    }
  }
LAB_009922db:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        if (m_states.erase(peer_id)) {
            LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Forget txreconciliation state of peer=%d\n", peer_id);
        }
    }